

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_end(Context *ctx)

{
  int iVar1;
  Context *ctx_local;
  
  iVar1 = shader_is_pixel(ctx);
  if (iVar1 != 0) {
    iVar1 = shader_version_atleast(ctx,'\x02','\0');
    if (iVar1 == 0) {
      set_used_register(ctx,REG_TYPE_COLOROUT,0,1);
      output_line(ctx,"MOV oC0, r0;");
    }
  }
  output_line(ctx,"END");
  return;
}

Assistant:

static void emit_ARB1_end(Context *ctx)
{
    // ps_1_* writes color to r0 instead oC0. We move it to the right place.
    // We don't have to worry about a RET opcode messing this up, since
    //  RET isn't available before ps_2_0.
    if (shader_is_pixel(ctx) && !shader_version_atleast(ctx, 2, 0))
    {
        set_used_register(ctx, REG_TYPE_COLOROUT, 0, 1);
        output_line(ctx, "MOV oC0, r0;");
    } // if

    output_line(ctx, "END");
}